

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

void __thiscall cmDocumentation::SetSection(cmDocumentation *this,char *name,char *(*docs) [2])

{
  cmDocumentationSection sec;
  cmDocumentationSection local_90;
  cmDocumentationSection local_58;
  
  cmDocumentationSection::cmDocumentationSection(&local_90,name);
  cmDocumentationSection::Append(&local_90,docs);
  cmDocumentationSection::cmDocumentationSection(&local_58,&local_90);
  SetSection(this,name,&local_58);
  cmDocumentationSection::~cmDocumentationSection(&local_58);
  cmDocumentationSection::~cmDocumentationSection(&local_90);
  return;
}

Assistant:

void cmDocumentation::SetSection(const char* name, const char* docs[][2])
{
  cmDocumentationSection sec{ name };
  sec.Append(docs);
  this->SetSection(name, std::move(sec));
}